

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.h
# Opt level: O2

void __thiscall
slang::ast::DistExpression::visitExprs<slang::ast::LocalVarCheckVisitor&>
          (DistExpression *this,LocalVarCheckVisitor *visitor)

{
  pointer pDVar1;
  size_t sVar2;
  DistItem *item;
  pointer pDVar3;
  long lVar4;
  
  Expression::visit<slang::ast::LocalVarCheckVisitor&>(this->left_,visitor);
  pDVar1 = (this->items_)._M_ptr;
  sVar2 = (this->items_)._M_extent._M_extent_value;
  pDVar3 = pDVar1;
  for (lVar4 = 0; sVar2 << 5 != lVar4; lVar4 = lVar4 + 0x20) {
    Expression::visit<slang::ast::LocalVarCheckVisitor&>(pDVar3->value,visitor);
    if ((pDVar3->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged
        == true) {
      Expression::visit<slang::ast::LocalVarCheckVisitor&>
                (*(Expression **)
                  ((long)&(pDVar1->weight).
                          super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
                          _M_payload.
                          super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                          _M_payload + lVar4 + 8),visitor);
    }
    pDVar3 = pDVar3 + 1;
  }
  if ((this->defaultWeight_).
      super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged != false) {
    Expression::visit<slang::ast::LocalVarCheckVisitor&>
              ((this->defaultWeight_).
               super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
               _M_value.expr,visitor);
    return;
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        left().visit(visitor);
        for (auto& item : items_) {
            item.value.visit(visitor);
            if (item.weight)
                item.weight->expr->visit(visitor);
        }

        if (defaultWeight_)
            defaultWeight_->expr->visit(visitor);
    }